

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::allocate_WorkAndBaseArrays(HModel *this)

{
  std::vector<double,_std::allocator<double>_>::resize(&this->workCost,(long)this->numTot);
  std::vector<double,_std::allocator<double>_>::resize(&this->workDual,(long)this->numTot);
  std::vector<double,_std::allocator<double>_>::resize(&this->workShift,(long)this->numTot);
  std::vector<double,_std::allocator<double>_>::resize(&this->workLower,(long)this->numTot);
  std::vector<double,_std::allocator<double>_>::resize(&this->workUpper,(long)this->numTot);
  std::vector<double,_std::allocator<double>_>::resize(&this->workRange,(long)this->numTot);
  std::vector<double,_std::allocator<double>_>::resize(&this->workValue,(long)this->numTot);
  std::vector<double,_std::allocator<double>_>::resize(&this->baseLower,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->baseUpper,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->baseValue,(long)this->numRow);
  return;
}

Assistant:

void HModel::allocate_WorkAndBaseArrays() {
  // Allocate bounds and solution spaces
  workCost.resize(numTot);
  workDual.resize(numTot);
  //Was workShift.assign(numTot, 0); but shift is populated by call to initCost()
  workShift.resize(numTot);

  workLower.resize(numTot);
  workUpper.resize(numTot);
  workRange.resize(numTot);
  workValue.resize(numTot);

  baseLower.resize(numRow);
  baseUpper.resize(numRow);
  baseValue.resize(numRow);
}